

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O2

void __thiscall
cmCPackArchiveGenerator::cmCPackArchiveGenerator
          (cmCPackArchiveGenerator *this,Compress compress,string *format,string *extension)

{
  cmCPackGenerator::cmCPackGenerator(&this->super_cmCPackGenerator);
  (this->super_cmCPackGenerator)._vptr_cmCPackGenerator = (_func_int **)&PTR_GetNameOfClass_0098ae10
  ;
  this->Compress = compress;
  std::__cxx11::string::string((string *)&this->ArchiveFormat,(string *)format);
  std::__cxx11::string::string((string *)&this->OutputExtension,(string *)extension);
  return;
}

Assistant:

cmCPackArchiveGenerator::cmCPackArchiveGenerator(
  cmArchiveWrite::Compress compress, std::string format, std::string extension)
  : Compress(compress)
  , ArchiveFormat(std::move(format))
  , OutputExtension(std::move(extension))
{
}